

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O3

void __thiscall cpprofiler::Connector::sendOverSocket(Connector *this)

{
  vector<char,_std::allocator<char>_> buf;
  vector<char,_std::allocator<char>_> local_28;
  
  if (this->_connected == true) {
    MessageMarshalling::serialize(&local_28,&this->marshalling);
    sendRawMsg(this,&local_28);
    if (local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void sendOverSocket() {
    if (!_connected) return;

    std::vector<char> buf = marshalling.serialize();

    sendRawMsg(buf);
  }